

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_msg * common_chat_parse_functionary_v3_2(string *input)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg_01;
  byte bVar1;
  bool bVar2;
  int iVar3;
  common_chat_msg *in_RDI;
  exception *e;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fun_it;
  smatch match;
  const_iterator end;
  const_iterator it;
  string content;
  common_chat_msg *res;
  undefined1 in_stack_000002ff;
  regex *in_stack_00000300;
  regex *in_stack_00000308;
  optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *in_stack_00000310;
  string *in_stack_00000318;
  undefined4 in_stack_fffffffffffffdf0;
  match_flag_type in_stack_fffffffffffffdf4;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffdf8;
  common_chat_msg *in_stack_fffffffffffffe00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe08;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined2 in_stack_fffffffffffffe24;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  char *in_stack_fffffffffffffe28;
  allocator<char> *__s;
  common_chat_msg *this;
  string local_1b0 [87];
  allocator<char> local_159 [9];
  char *local_150;
  string local_148 [39];
  undefined1 local_121;
  uint local_120;
  undefined1 local_119 [55];
  undefined1 local_e2;
  undefined1 local_e1 [9];
  char *local_d8;
  string local_d0 [32];
  char *local_b0;
  undefined8 local_a8;
  char *local_a0;
  allocator<char> local_71;
  string local_70 [40];
  char *local_48;
  string local_40 [64];
  
  this = in_RDI;
  if ((common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::function_regex_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                                   function_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)this,
               in_stack_fffffffffffffe28,
               CONCAT13(in_stack_fffffffffffffe27,
                        CONCAT12(in_stack_fffffffffffffe26,in_stack_fffffffffffffe24)));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                  function_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                         function_regex_abi_cxx11_);
  }
  if ((common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::close_regex_abi_cxx11_ ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                                   close_regex_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)this,
               in_stack_fffffffffffffe28,
               CONCAT13(in_stack_fffffffffffffe27,
                        CONCAT12(in_stack_fffffffffffffe26,in_stack_fffffffffffffe24)));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                  close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                         close_regex_abi_cxx11_);
  }
  std::__cxx11::string::string(local_40);
  local_48 = (char *)std::__cxx11::string::begin();
  local_70._32_8_ = std::__cxx11::string::end();
  __s = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&this->role,(char *)__s,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,
                               CONCAT24(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20))));
  bVar1 = parse_literal((const_iterator *)in_stack_fffffffffffffe18._M_current,
                        (const_iterator *)in_stack_fffffffffffffe10._M_current,
                        (string *)in_stack_fffffffffffffe08._M_current);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_a0 = local_48;
    local_a8 = local_70._32_8_;
    bVar2 = std::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4);
    in_stack_fffffffffffffe26 = bVar2;
    if (bVar2) {
      in_stack_fffffffffffffe18._M_current =
           (char *)std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::prefix((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      local_e1._1_8_ =
           (((const_reference)in_stack_fffffffffffffe18._M_current)->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
      local_d8 = local_48;
      in_stack_fffffffffffffe10._M_current = local_e1;
      local_b0 = (char *)local_e1._1_8_;
      std::allocator<char>::allocator();
      __beg._M_current._4_2_ = in_stack_fffffffffffffe24;
      __beg._M_current._0_4_ = in_stack_fffffffffffffe20;
      __beg._M_current._6_1_ = in_stack_fffffffffffffe26;
      __beg._M_current._7_1_ = bVar1;
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10._M_current,__beg,in_stack_fffffffffffffe18,
                 (allocator<char> *)in_stack_fffffffffffffe08._M_current);
      std::__cxx11::string::operator=(local_40,local_d0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)local_e1);
      local_48 = local_b0;
    }
    else {
      local_e2 = 0;
      common_chat_msg::common_chat_msg(in_stack_fffffffffffffe00);
      std::__cxx11::string::operator=((string *)this,"assistant");
      local_119._9_8_ = local_48;
      local_119[1] = local_70[0x20];
      local_119[2] = local_70[0x21];
      local_119[3] = local_70[0x22];
      local_119[4] = local_70[0x23];
      local_119[5] = local_70[0x24];
      local_119[6] = local_70[0x25];
      local_119[7] = local_70[0x26];
      local_119[8] = local_70[0x27];
      in_stack_fffffffffffffe08._M_current = local_119;
      std::allocator<char>::allocator();
      __beg_00._M_current._4_2_ = in_stack_fffffffffffffe24;
      __beg_00._M_current._0_4_ = in_stack_fffffffffffffe20;
      __beg_00._M_current._6_1_ = in_stack_fffffffffffffe26;
      __beg_00._M_current._7_1_ = bVar1;
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10._M_current,__beg_00,in_stack_fffffffffffffe18,
                 (allocator<char> *)in_stack_fffffffffffffe08._M_current);
      std::__cxx11::string::operator=((string *)&this->content,(string *)(local_119 + 0x11));
      std::__cxx11::string::~string((string *)(local_119 + 0x11));
      std::allocator<char>::~allocator((allocator<char> *)local_119);
      local_e2 = 1;
    }
    local_120 = (uint)!bVar2;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x24a4cc);
    if (local_120 != 0) goto LAB_0024a7ad;
  }
  local_121 = 0;
  local_150 = local_48;
  local_159[1] = (allocator<char>)local_70[0x20];
  local_159[2] = (allocator<char>)local_70[0x21];
  local_159[3] = (allocator<char>)local_70[0x22];
  local_159[4] = (allocator<char>)local_70[0x23];
  local_159[5] = (allocator<char>)local_70[0x24];
  local_159[6] = (allocator<char>)local_70[0x25];
  local_159[7] = (allocator<char>)local_70[0x26];
  local_159[8] = (allocator<char>)local_70[0x27];
  std::allocator<char>::allocator();
  __beg_01._M_current._4_2_ = in_stack_fffffffffffffe24;
  __beg_01._M_current._0_4_ = in_stack_fffffffffffffe20;
  __beg_01._M_current._6_1_ = in_stack_fffffffffffffe26;
  __beg_01._M_current._7_1_ = bVar1;
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10._M_current,__beg_01,in_stack_fffffffffffffe18,
             (allocator<char> *)in_stack_fffffffffffffe08._M_current);
  std::optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::optional();
  parse_json_tool_calls
            (in_stack_00000318,in_stack_00000310,in_stack_00000308,in_stack_00000300,
             (bool)in_stack_000002ff);
  std::optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::~optional
            ((optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
             0x24a59b);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(local_159);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe18._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe10._M_current);
  std::__cxx11::string::operator=((string *)&this->content,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  local_120 = 1;
  local_121 = 1;
LAB_0024a7ad:
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static common_chat_msg common_chat_parse_functionary_v3_2(const std::string & input) {
    static const std::regex function_regex(R"((?:>>>)?(?:assistant<|end_header_id|>\n)?(\w+)\n)");
    static const std::regex close_regex(R"($|(?=>>>))");

    std::string content;
    auto it = input.begin();
    const auto end = input.end();

    if (parse_literal(it, end, "all\n")) {
        std::smatch match;
        if (std::regex_search(it, end, match, function_regex)) {
            auto fun_it = match.prefix().second;
            content = std::string(it, fun_it);
            it = fun_it;
        } else {
            common_chat_msg res;
            res.role = "assistant";
            res.content = std::string(it, end);
            return res;
        }
    }
    // TODO: tighten & simplify.
    try {
        auto res = parse_json_tool_calls(std::string(it, end), std::nullopt, function_regex, close_regex, /* allow_raw_python= */ true);
        res.content = content + res.content;
        return res;
    } catch (const std::exception & e) {
        LOG_ERR("Failed to parse functionary v3.2 input: %s\n", e.what());
        common_chat_msg res;
        res.role = "assistant";
        res.content = input;
        return res;
    }
}